

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Span<QHashPrivate::Node<ProKey,_ProFunctionDef>_>::erase
          (Span<QHashPrivate::Node<ProKey,_ProFunctionDef>_> *this,size_t bucket)

{
  Entry *pEVar1;
  byte bVar2;
  ProFile *this_00;
  int *piVar3;
  
  bVar2 = this->offsets[bucket];
  this->offsets[bucket] = 0xff;
  pEVar1 = this->entries + bVar2;
  this_00 = *(ProFile **)(this->entries[bVar2].storage.data + 0x30);
  if (this_00 != (ProFile *)0x0) {
    ProFile::deref(this_00);
  }
  piVar3 = *(int **)(pEVar1->storage).data;
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      QArrayData::deallocate(*(QArrayData **)(pEVar1->storage).data,2,0x10);
    }
  }
  this->entries[bVar2].storage.data[0] = this->nextFree;
  this->nextFree = bVar2;
  return;
}

Assistant:

void erase(size_t bucket) noexcept(std::is_nothrow_destructible<Node>::value)
    {
        Q_ASSERT(bucket < SpanConstants::NEntries);
        Q_ASSERT(offsets[bucket] != SpanConstants::UnusedEntry);

        unsigned char entry = offsets[bucket];
        offsets[bucket] = SpanConstants::UnusedEntry;

        entries[entry].node().~Node();
        entries[entry].nextFree() = nextFree;
        nextFree = entry;
    }